

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer.cpp
# Opt level: O2

void __thiscall bidfx_public_api::tools::ByteBuffer::Compact(ByteBuffer *this)

{
  size_t sVar1;
  long lVar2;
  
  sVar1 = this->reader_index_;
  for (lVar2 = 0; sVar1 + lVar2 < this->writer_index_; lVar2 = lVar2 + 1) {
    this->buf_[lVar2] = this->buf_[sVar1 + lVar2];
  }
  this->writer_index_ = this->writer_index_ - this->reader_index_;
  this->reader_index_ = 0;
  return;
}

Assistant:

void ByteBuffer::Compact()
{
    int count = 0;
    for (size_t i = reader_index_; i < writer_index_; i++)
    {
        buf_[count] = buf_[i];
        count++;
    }
    writer_index_ -= reader_index_;
    reader_index_ = 0;
}